

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O0

int yescrypt_kdf(yescrypt_shared_t *shared,yescrypt_local_t *local,uint8_t *passwd,size_t passwdlen,
                uint8_t *salt,size_t saltlen,uint64_t N,uint32_t r,uint32_t p,uint32_t t,uint32_t g,
                yescrypt_flags_t flags,uint8_t *buf,size_t buflen)

{
  undefined1 *puVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined1 *in_RDX;
  bool bVar3;
  ulong in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int in_stack_00000028;
  uint in_stack_00000030;
  undefined1 *in_stack_00000038;
  undefined8 in_stack_00000040;
  int retval_1;
  size_t dklen;
  uint8_t *dkp;
  int retval;
  uint8_t dk [32];
  size_t in_stack_00000238;
  uint8_t *in_stack_00000240;
  size_t in_stack_00000248;
  uint8_t *in_stack_00000250;
  yescrypt_local_t *in_stack_00000258;
  yescrypt_shared_t *in_stack_00000260;
  uint64_t in_stack_00000290;
  uint32_t in_stack_00000298;
  uint32_t in_stack_000002a0;
  uint32_t in_stack_000002a8;
  yescrypt_flags_t in_stack_000002b0;
  uint8_t *in_stack_000002b8;
  size_t in_stack_000002c0;
  undefined8 local_a8;
  undefined1 local_78 [48];
  undefined8 local_48;
  undefined1 *local_40;
  
  local_48 = in_RCX;
  local_40 = in_RDX;
  if (((((in_stack_00000030 & 0x30001) == 1) && (in_stack_00000018 != 0)) &&
      (0xff < in_stack_00000008 / in_stack_00000018)) &&
     (0x1ffff < (in_stack_00000008 / in_stack_00000018) * (ulong)in_stack_00000010)) {
    iVar2 = yescrypt_kdf_body(in_stack_00000260,in_stack_00000258,in_stack_00000250,
                              in_stack_00000248,in_stack_00000240,in_stack_00000238,
                              in_stack_00000290,in_stack_00000298,in_stack_000002a0,
                              in_stack_000002a8,in_stack_000002b0,in_stack_000002b8,
                              in_stack_000002c0);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_40 = local_78;
    local_48 = 0x20;
  }
  do {
    if (in_stack_00000028 == 0) {
      local_a8 = in_stack_00000040;
      puVar1 = in_stack_00000038;
    }
    else {
      local_a8 = 0x20;
      puVar1 = local_78;
    }
    iVar2 = yescrypt_kdf_body(in_stack_00000260,in_stack_00000258,in_stack_00000250,
                              in_stack_00000248,in_stack_00000240,in_stack_00000238,
                              in_stack_00000290,in_stack_00000298,in_stack_000002a0,
                              in_stack_000002a8,in_stack_000002b0,in_stack_000002b8,
                              in_stack_000002c0);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_48 = local_a8;
    in_stack_00000008 = in_stack_00000008 << 2;
    if (in_stack_00000008 == 0) {
      return -1;
    }
    bVar3 = in_stack_00000028 != 0;
    in_stack_00000028 = in_stack_00000028 + -1;
    local_40 = puVar1;
  } while (bVar3);
  return 0;
}

Assistant:

int
yescrypt_kdf(const yescrypt_shared_t * shared, yescrypt_local_t * local,
    const uint8_t * passwd, size_t passwdlen,
    const uint8_t * salt, size_t saltlen,
    uint64_t N, uint32_t r, uint32_t p, uint32_t t, uint32_t g,
    yescrypt_flags_t flags,
    uint8_t * buf, size_t buflen)
{
	uint8_t dk[32];

	if ((flags & (YESCRYPT_RW | __YESCRYPT_INIT_SHARED)) == YESCRYPT_RW &&
	    p >= 1 && N / p >= 0x100 && N / p * r >= 0x20000) {
		int retval = yescrypt_kdf_body(shared, local,
		    passwd, passwdlen, salt, saltlen,
		    N >> 6, r, p, 0, flags | __YESCRYPT_PREHASH,
		    dk, sizeof(dk));
		if (retval)
			return retval;
		passwd = dk;
		passwdlen = sizeof(dk);
	}

	do {
		uint8_t * dkp = g ? dk : buf;
		size_t dklen = g ? sizeof(dk) : buflen;
		int retval = yescrypt_kdf_body(shared, local,
		    passwd, passwdlen, salt, saltlen,
		    N, r, p, t, flags, dkp, dklen);
		if (retval)
			return retval;

		passwd = dkp;
		passwdlen = dklen;

		N <<= 2;
		if (!N)
			return -1;
		t >>= 1;
	} while (g--);

	return 0;
}